

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O2

void __thiscall chrono::ChConstraintTwoGeneric::Update_auxiliary(ChConstraintTwoGeneric *this)

{
  double dVar1;
  ChVariables *pCVar2;
  int iVar3;
  Scalar SVar4;
  ChRowVectorDynamic<double> *local_80;
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_78;
  void *local_60;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_50 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_38 [24];
  
  pCVar2 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar2->disabled == false) {
    iVar3 = (*pCVar2->_vptr_ChVariables[2])();
    if (0 < iVar3) {
      pCVar2 = (this->super_ChConstraintTwo).variables_a;
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
                (local_38,&(this->Eq_a).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (type *)0x0);
      local_80 = &this->Cq_a;
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
                ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_78,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_80,
                 (type *)0x0);
      (*pCVar2->_vptr_ChVariables[4])(pCVar2,local_38,&local_78);
      Eigen::internal::handmade_aligned_free(local_60);
    }
  }
  pCVar2 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar2->disabled == false) {
    iVar3 = (*pCVar2->_vptr_ChVariables[2])();
    if (0 < iVar3) {
      pCVar2 = (this->super_ChConstraintTwo).variables_b;
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
                (local_50,&(this->Eq_b).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (type *)0x0);
      local_80 = &this->Cq_b;
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
                ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_78,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_80,
                 (type *)0x0);
      (*pCVar2->_vptr_ChVariables[4])(pCVar2,local_50,&local_78);
      Eigen::internal::handmade_aligned_free(local_60);
    }
  }
  (this->super_ChConstraintTwo).super_ChConstraint.g_i = 0.0;
  pCVar2 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar2->disabled == false) {
    iVar3 = (*pCVar2->_vptr_ChVariables[2])();
    if (0 < iVar3) {
      local_78 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&this->Cq_a,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Eq_a);
      SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base *)&local_78);
      (this->super_ChConstraintTwo).super_ChConstraint.g_i =
           SVar4 + (this->super_ChConstraintTwo).super_ChConstraint.g_i;
    }
  }
  pCVar2 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar2->disabled == false) {
    iVar3 = (*pCVar2->_vptr_ChVariables[2])();
    if (0 < iVar3) {
      local_78 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&this->Cq_b,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Eq_b);
      SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base *)&local_78);
      (this->super_ChConstraintTwo).super_ChConstraint.g_i =
           SVar4 + (this->super_ChConstraintTwo).super_ChConstraint.g_i;
    }
  }
  dVar1 = (this->super_ChConstraintTwo).super_ChConstraint.cfm_i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (this->super_ChConstraintTwo).super_ChConstraint.g_i =
         dVar1 + (this->super_ChConstraintTwo).super_ChConstraint.g_i;
  }
  return;
}

Assistant:

void ChConstraintTwoGeneric::Update_auxiliary() {
    // 1- Assuming jacobians are already computed, now compute
    //   the matrices [Eq_a]=[invM_a]*[Cq_a]' and [Eq_b]
    if (variables_a->IsActive() && variables_a->Get_ndof() > 0) {
        variables_a->Compute_invMb_v(Eq_a, Cq_a.transpose());
    }
    if (variables_b->IsActive() && variables_b->Get_ndof() > 0) {
        variables_b->Compute_invMb_v(Eq_b, Cq_b.transpose());
    }

    // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
    g_i = 0;
    if (variables_a->IsActive() && variables_a->Get_ndof() > 0) {
        g_i += Cq_a * Eq_a;
    }
    if (variables_b->IsActive() && variables_b->Get_ndof() > 0) {
        g_i += Cq_b * Eq_b;
    }

    // 3- adds the constraint force mixing term (usually zero):
    if (cfm_i != 0)
        g_i += cfm_i;
}